

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::Result(JunitReporter *this,AssertionResult *assertionResult)

{
  long *plVar1;
  OfType OVar2;
  pointer pTVar3;
  pointer pcVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  char cVar8;
  IConfig *unaff_R12;
  long lVar9;
  TestStats stats;
  ostringstream oss;
  char *local_250;
  long local_248;
  char local_240 [16];
  size_t local_230;
  undefined1 local_228 [32];
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  OVar2 = (assertionResult->m_resultData).resultType;
  if (OVar2 == Ok) {
    unaff_R12 = (this->m_config).m_fullConfig.m_p;
    if (unaff_R12 != (IConfig *)0x0) {
      (*(unaff_R12->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(unaff_R12);
    }
    iVar5 = (*(unaff_R12->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(unaff_R12);
    cVar8 = (char)iVar5;
  }
  else {
    cVar8 = '\x01';
  }
  if (unaff_R12 != (IConfig *)0x0 && OVar2 == Ok) {
    (*(unaff_R12->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(unaff_R12);
  }
  if (cVar8 == '\0') {
    return;
  }
  pTVar3 = (this->m_currentStats->m_testCaseStats).
           super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_228._0_8_ = local_228 + 0x10;
  local_228._8_8_ = (char *)0x0;
  local_228[0x10] = '\0';
  local_208._M_p = (pointer)&local_1f8;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_p = (pointer)&local_1d8;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar4 = (assertionResult->m_resultData).message._M_dataplus._M_p;
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar4,
             pcVar4 + (assertionResult->m_resultData).message._M_string_length);
  lVar9 = local_248;
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (lVar9 != 0) {
    pcVar4 = (assertionResult->m_resultData).message._M_dataplus._M_p;
    local_250 = local_240;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,pcVar4,
               pcVar4 + (assertionResult->m_resultData).message._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_250,local_248);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," at ",4);
    if (local_250 != local_240) {
      operator_delete(local_250);
    }
  }
  pcVar4 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar4,
             pcVar4 + (assertionResult->m_info).lineInfo.file._M_string_length);
  local_230 = (assertionResult->m_info).lineInfo.line;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_250,local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_250);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  pcVar4 = (assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar4,
             pcVar4 + (assertionResult->m_resultData).reconstructedExpression._M_string_length);
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_250);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  pcVar4 = (assertionResult->m_info).macroName._M_dataplus._M_p;
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar4,
             pcVar4 + (assertionResult->m_info).macroName._M_string_length);
  std::__cxx11::string::operator=((string *)&local_208,(string *)&local_250);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  OVar2 = (assertionResult->m_resultData).resultType;
  if (OVar2 < ExpressionFailed) {
    switch(OVar2) {
    case Ok:
      pcVar7 = "success";
      break;
    case Info:
      pcVar7 = "info";
      break;
    case Warning:
      pcVar7 = "warning";
      break;
    default:
      if (OVar2 != FailureBit) goto LAB_001339f8;
    case Unknown:
switchD_00133922_caseD_ffffffff:
      pcVar7 = "* internal error *";
    }
    std::__cxx11::string::_M_replace((ulong)local_228,0,(char *)local_228._8_8_,(ulong)pcVar7);
  }
  else {
    if (OVar2 < ThrewException) {
      if (1 < (uint)(OVar2 + ~FailureBit)) {
        if (OVar2 != Exception) goto LAB_001339f8;
        goto switchD_00133922_caseD_ffffffff;
      }
LAB_00133963:
      lVar9 = 8;
      std::__cxx11::string::_M_replace((ulong)local_228,0,(char *)local_228._8_8_,0x14e964);
    }
    else {
      if (OVar2 != ThrewException) {
        if (OVar2 != DidntThrowException) goto LAB_001339f8;
        goto LAB_00133963;
      }
      lVar9 = 0x18;
      std::__cxx11::string::_M_replace((ulong)local_228,0,(char *)local_228._8_8_,0x14f648);
    }
    plVar1 = (long *)((long)&this->m_currentStats->m_testsCount + lVar9);
    *plVar1 = *plVar1 + 1;
  }
LAB_001339f8:
  std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
  push_back(&pTVar3[-1].m_testStats,(value_type *)local_228);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p);
  }
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_);
  }
  return;
}

Assistant:

virtual void Result( const Catch::AssertionResult& assertionResult ) {
            if( assertionResult.getResultType() != ResultWas::Ok || m_config.fullConfig()->includeSuccessfulResults() ) {
                TestCaseStats& testCaseStats = m_currentStats->m_testCaseStats.back();
                TestStats stats;
                std::ostringstream oss;
                if( !assertionResult.getMessage().empty() )
                    oss << assertionResult.getMessage() << " at ";
                oss << assertionResult.getSourceInfo();
                stats.m_content = oss.str();
                stats.m_message = assertionResult.getExpandedExpression();
                stats.m_resultType = assertionResult.getTestMacroName();

                switch( assertionResult.getResultType() ) {
                    case ResultWas::ThrewException:
                        stats.m_element = "error";
                        m_currentStats->m_errorsCount++;
                        break;
                    case ResultWas::Info:
                        stats.m_element = "info"; // !TBD ?
                        break;
                    case ResultWas::Warning:
                        stats.m_element = "warning"; // !TBD ?
                        break;
                    case ResultWas::ExplicitFailure:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::ExpressionFailed:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::Ok:
                        stats.m_element = "success";
                        break;
                    case ResultWas::DidntThrowException:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        stats.m_element = "* internal error *";
                        break;
                }
                testCaseStats.m_testStats.push_back( stats );
            }
        }